

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLogLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYRef<unsigned_int>,_ImPlot::TransformerLogLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  uint uVar8;
  ImU32 IVar9;
  GetterXsYs<unsigned_int> *pGVar10;
  TransformerLogLog *pTVar11;
  ImPlotPlot *pIVar12;
  GetterXsYRef<unsigned_int> *pGVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  ImDrawIdx IVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  pIVar16 = GImPlot;
  pGVar10 = this->Getter1;
  pTVar11 = this->Transformer;
  iVar7 = pGVar10->Count;
  lVar19 = (long)(((pGVar10->Offset + prim) % iVar7 + iVar7) % iVar7) * (long)pGVar10->Stride;
  uVar8 = *(uint *)((long)pGVar10->Ys + lVar19);
  dVar24 = log10((double)*(uint *)((long)pGVar10->Xs + lVar19) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar16->LogDenX;
  pIVar12 = pIVar16->CurrentPlot;
  dVar3 = (pIVar12->XAxis).Range.Min;
  dVar4 = (pIVar12->XAxis).Range.Max;
  dVar25 = log10((double)uVar8 / pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar7 = pTVar11->YAxis;
  pIVar12 = pIVar16->CurrentPlot;
  dVar5 = pIVar12->YAxis[iVar7].Range.Min;
  fVar26 = (float)((((double)(float)(dVar24 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar12->XAxis).Range.Min) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar7].Min.x);
  fVar21 = (float)((((double)(float)(dVar25 / pIVar16->LogDenY[iVar7]) *
                     (pIVar12->YAxis[iVar7].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar16->My[iVar7] + (double)pIVar16->PixelRange[iVar7].Min.y);
  pGVar13 = this->Getter2;
  pTVar11 = this->Transformer;
  iVar7 = pGVar13->Count;
  dVar2 = pGVar13->YRef;
  dVar24 = log10((double)*(uint *)((long)pGVar13->Xs +
                                  (long)(((prim + pGVar13->Offset) % iVar7 + iVar7) % iVar7) *
                                  (long)pGVar13->Stride) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar17->LogDenX;
  pIVar12 = pIVar17->CurrentPlot;
  dVar4 = (pIVar12->XAxis).Range.Min;
  dVar5 = (pIVar12->XAxis).Range.Max;
  dVar25 = log10(dVar2 / pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  iVar7 = pTVar11->YAxis;
  pIVar12 = pIVar17->CurrentPlot;
  dVar2 = pIVar12->YAxis[iVar7].Range.Min;
  fVar27 = (float)((((double)(float)(dVar24 / dVar3) * (dVar5 - dVar4) + dVar4) -
                   (pIVar12->XAxis).Range.Min) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar7].Min.x);
  fVar28 = (float)((((double)(float)(dVar25 / pIVar17->LogDenY[iVar7]) *
                     (pIVar12->YAxis[iVar7].Range.Max - dVar2) + dVar2) - dVar2) *
                   pIVar17->My[iVar7] + (double)pIVar17->PixelRange[iVar7].Min.y);
  fVar22 = fVar21;
  if (fVar28 <= fVar21) {
    fVar22 = fVar28;
  }
  bVar20 = false;
  if ((fVar22 < (cull_rect->Max).y) &&
     (fVar22 = (float)(~-(uint)(fVar28 <= fVar21) & (uint)fVar28 |
                      -(uint)(fVar28 <= fVar21) & (uint)fVar21), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar22 && fVar22 != *pfVar1)) {
    fVar22 = fVar26;
    if (fVar27 <= fVar26) {
      fVar22 = fVar27;
    }
    bVar20 = false;
    if (fVar22 < (cull_rect->Max).x) {
      fVar22 = (float)(~-(uint)(fVar27 <= fVar26) & (uint)fVar27 |
                      -(uint)(fVar27 <= fVar26) & (uint)fVar26);
      bVar20 = (cull_rect->Min).x <= fVar22 && fVar22 != (cull_rect->Min).x;
    }
  }
  if (bVar20 != false) {
    fVar22 = this->Weight;
    IVar9 = this->Col;
    IVar6 = *uv;
    fVar29 = fVar27 - fVar26;
    fVar30 = fVar28 - fVar21;
    fVar23 = fVar29 * fVar29 + fVar30 * fVar30;
    if (0.0 < fVar23) {
      if (fVar23 < 0.0) {
        fVar23 = sqrtf(fVar23);
      }
      else {
        fVar23 = SQRT(fVar23);
      }
      fVar29 = fVar29 * (1.0 / fVar23);
      fVar30 = fVar30 * (1.0 / fVar23);
    }
    fVar22 = fVar22 * 0.5;
    fVar29 = fVar29 * fVar22;
    fVar22 = fVar22 * fVar30;
    pIVar14 = DrawList->_VtxWritePtr;
    (pIVar14->pos).x = fVar22 + fVar26;
    (pIVar14->pos).y = fVar21 - fVar29;
    pIVar14->uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar9;
    pIVar14[1].pos.x = fVar22 + fVar27;
    pIVar14[1].pos.y = fVar28 - fVar29;
    pIVar14[1].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar9;
    pIVar14[2].pos.x = fVar27 - fVar22;
    pIVar14[2].pos.y = fVar29 + fVar28;
    pIVar14[2].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar9;
    pIVar14[3].pos.x = fVar26 - fVar22;
    pIVar14[3].pos.y = fVar29 + fVar21;
    pIVar14[3].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar9;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    uVar8 = DrawList->_VtxCurrentIdx;
    pIVar15 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar8;
    *pIVar15 = IVar18;
    pIVar15[1] = IVar18 + 1;
    pIVar15[2] = IVar18 + 2;
    pIVar15[3] = IVar18;
    pIVar15[4] = IVar18 + 2;
    pIVar15[5] = IVar18 + 3;
    DrawList->_IdxWritePtr = pIVar15 + 6;
    DrawList->_VtxCurrentIdx = uVar8 + 4;
  }
  return bVar20;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }